

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

int string2ll(char *s,size_t slen,longlong *value)

{
  bool bVar1;
  bool bVar2;
  ulong local_48;
  unsigned_long_long v;
  ulong uStack_38;
  int negative;
  size_t plen;
  char *p;
  longlong *value_local;
  size_t slen_local;
  char *s_local;
  
  uStack_38 = 0;
  bVar2 = false;
  if (slen == 0) {
    s_local._4_4_ = -1;
  }
  else if ((slen == 1) && (*s == '0')) {
    if (value != (longlong *)0x0) {
      *value = 0;
    }
    s_local._4_4_ = 0;
  }
  else {
    plen = (size_t)s;
    if (*s == '-') {
      bVar2 = true;
      plen = (size_t)(s + 1);
      uStack_38 = 1;
      if (slen == 1) {
        return -1;
      }
    }
    if ((*(char *)plen < '1') || ('9' < *(char *)plen)) {
      if ((*(char *)plen == '0') && (slen == 1)) {
        *value = 0;
        s_local._4_4_ = 0;
      }
      else {
        s_local._4_4_ = -1;
      }
    }
    else {
      local_48 = (ulong)(*(char *)plen + -0x30);
      while( true ) {
        plen = plen + 1;
        uStack_38 = uStack_38 + 1;
        bVar1 = false;
        if ((uStack_38 < slen) && (bVar1 = false, '/' < *(char *)plen)) {
          bVar1 = *(char *)plen < ':';
        }
        if (!bVar1) {
          if (uStack_38 < slen) {
            return -1;
          }
          if (bVar2) {
            if (0x8000000000000000 < local_48) {
              return -1;
            }
            if (value != (longlong *)0x0) {
              *value = -local_48;
            }
          }
          else {
            if (0x7fffffffffffffff < local_48) {
              return -1;
            }
            if (value != (longlong *)0x0) {
              *value = local_48;
            }
          }
          return 0;
        }
        if (0x1999999999999999 < local_48) {
          return -1;
        }
        if (-(long)(*(char *)plen + -0x30) - 1U < local_48 * 10) break;
        local_48 = (long)(*(char *)plen + -0x30) + local_48 * 10;
      }
      s_local._4_4_ = -1;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int string2ll(const char *s, size_t slen, long long *value) {
    const char *p = s;
    size_t plen = 0;
    int negative = 0;
    unsigned long long v;

    if (plen == slen)
        return REDIS_ERR;

    /* Special case: first and only digit is 0. */
    if (slen == 1 && p[0] == '0') {
        if (value != NULL) *value = 0;
        return REDIS_OK;
    }

    if (p[0] == '-') {
        negative = 1;
        p++; plen++;

        /* Abort on only a negative sign. */
        if (plen == slen)
            return REDIS_ERR;
    }

    /* First digit should be 1-9, otherwise the string should just be 0. */
    if (p[0] >= '1' && p[0] <= '9') {
        v = p[0]-'0';
        p++; plen++;
    } else if (p[0] == '0' && slen == 1) {
        *value = 0;
        return REDIS_OK;
    } else {
        return REDIS_ERR;
    }

    while (plen < slen && p[0] >= '0' && p[0] <= '9') {
        if (v > (ULLONG_MAX / 10)) /* Overflow. */
            return REDIS_ERR;
        v *= 10;

        if (v > (ULLONG_MAX - (p[0]-'0'))) /* Overflow. */
            return REDIS_ERR;
        v += p[0]-'0';

        p++; plen++;
    }

    /* Return if not all bytes were used. */
    if (plen < slen)
        return REDIS_ERR;

    if (negative) {
        if (v > ((unsigned long long)(-(LLONG_MIN+1))+1)) /* Overflow. */
            return REDIS_ERR;
        if (value != NULL) *value = -v;
    } else {
        if (v > LLONG_MAX) /* Overflow. */
            return REDIS_ERR;
        if (value != NULL) *value = v;
    }
    return REDIS_OK;
}